

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<std::complex<double>_>::Decompose_Cholesky(TPZMatrix<std::complex<double>_> *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int extraout_var;
  TPZMatrix<std::complex<double>_> *pTVar4;
  int64_t k_1;
  int64_t k;
  long lVar5;
  long lVar6;
  long lVar7;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double in_XMM1_Qa;
  ulong in_XMM1_Qb;
  complex<double> a;
  undefined1 local_a8 [16];
  complex<double> tmp;
  undefined1 local_88 [16];
  double local_78;
  ulong uStack_70;
  double local_68;
  long local_58;
  long local_50;
  long local_48;
  undefined1 local_40 [16];
  
  cVar1 = (this->super_TPZBaseMatrix).fDecomposed;
  if ((cVar1 != '\0') && (cVar1 != '\x03')) {
    Error("Decompose_Cholesky <Matrix already Decomposed>",(char *)0x0);
    cVar1 = (this->super_TPZBaseMatrix).fDecomposed;
  }
  if (cVar1 == '\0') {
    if ((this->super_TPZBaseMatrix).fRow != (this->super_TPZBaseMatrix).fCol) {
      Error("Decompose_Cholesky <Matrix must be square>",(char *)0x0);
    }
    iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    local_48 = CONCAT44(extraout_var,iVar3);
    local_58 = 0;
    if (local_48 != 0 && -1 < extraout_var) {
      local_58 = local_48;
    }
    lVar5 = 0;
    while (lVar7 = lVar5, lVar7 != local_58) {
      for (lVar5 = 0; lVar7 != lVar5; lVar5 = lVar5 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar7,lVar5);
        tmp._M_value._8_8_ = in_XMM1_Qa;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar7,lVar5);
        in_XMM1_Qa = -in_XMM1_Qa;
        in_XMM1_Qb = in_XMM1_Qb ^ 0x8000000000000000;
        local_a8._8_8_ = in_XMM1_Qa;
        std::operator*(&tmp,(complex<double> *)local_a8);
        local_78 = in_XMM1_Qa;
        uStack_70 = in_XMM1_Qb;
        local_68 = extraout_XMM0_Qa;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar7,lVar7);
        tmp._M_value._0_8_ = extraout_XMM0_Qa_00 - (local_68 + 0.0);
        tmp._M_value._8_8_ = in_XMM1_Qa - (local_78 + 0.0);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar7,lVar7,&tmp);
      }
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar7,lVar7);
      local_a8._0_8_ = extraout_XMM0_Qa_01;
      local_a8._8_8_ = in_XMM1_Qa;
      std::sqrt<double>((complex<double> *)local_a8);
      tmp._M_value._0_8_ = extraout_XMM0_Qa_02;
      tmp._M_value._8_8_ = in_XMM1_Qa;
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])(this,lVar7,lVar7,&tmp);
      lVar6 = lVar7 + 1;
      local_50 = lVar6;
      for (; lVar5 = local_50, lVar6 < local_48; lVar6 = lVar6 + 1) {
        for (lVar5 = 0; lVar7 != lVar5; lVar5 = lVar5 + 1) {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar7,lVar5);
          local_a8._8_8_ = in_XMM1_Qa;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar6,lVar5);
          in_XMM1_Qa = -in_XMM1_Qa;
          in_XMM1_Qb = in_XMM1_Qb ^ 0x8000000000000000;
          local_88._8_8_ = in_XMM1_Qa;
          std::operator*((complex<double> *)local_a8,(complex<double> *)local_88);
          local_78 = in_XMM1_Qa;
          uStack_70 = in_XMM1_Qb;
          local_68 = extraout_XMM0_Qa_03;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar7,lVar6);
          local_a8._0_8_ = extraout_XMM0_Qa_04 - (local_68 + 0.0);
          local_a8._8_8_ = in_XMM1_Qa - (local_78 + 0.0);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar7,lVar6,local_a8);
        }
        lVar5 = lVar7;
        pTVar4 = this;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar7,lVar7);
        a._M_value._8_8_ = lVar5;
        a._M_value._0_8_ = pTVar4;
        bVar2 = IsZero(a);
        if (bVar2) {
          Error("Decompose_Cholesky <Zero on diagonal>",(char *)0x0);
        }
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar7,lVar6);
        local_88._8_8_ = in_XMM1_Qa;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar7,lVar7);
        local_40._8_8_ = in_XMM1_Qa;
        std::operator/((complex<double> *)local_88,(complex<double> *)local_40);
        local_a8._8_8_ = in_XMM1_Qa;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar7,lVar6,local_a8);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar7,lVar6);
        in_XMM1_Qa = -in_XMM1_Qa;
        in_XMM1_Qb = in_XMM1_Qb ^ 0x8000000000000000;
        local_a8._0_8_ = extraout_XMM0_Qa_05;
        local_a8._8_8_ = in_XMM1_Qa;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar6,lVar7,local_a8);
      }
    }
    (this->super_TPZBaseMatrix).fDecomposed = '\x03';
  }
  return 3;
}

Assistant:

int TPZMatrix<TVar>::Decompose_Cholesky() {
	if (  fDecomposed && fDecomposed != ECholesky) Error( "Decompose_Cholesky <Matrix already Decomposed>" );
	if (  fDecomposed ) return ECholesky;
	if ( Rows()!=Cols() ) Error( "Decompose_Cholesky <Matrix must be square>" );
	//return 0;
	
	int64_t dim=Dim();
	for (int64_t i=0 ; i<dim; i++) {
		for(int64_t k=0; k<i; k++) {//diagonal elements
            TVar sum = 0;
            if constexpr (is_complex<TVar>::value){
                sum += GetVal(i,k)*std::conj(GetVal(i,k));
            }else{
                sum += GetVal(i,k)*GetVal(i,k);
            }
            PutVal( i,i,GetVal(i,i)-sum );
		}
		TVar tmp = sqrt(GetVal(i,i));
        PutVal( i,i,tmp );
        for (int64_t j=i+1;j<dim; j++) {//off-diagonal elements
            for(int64_t k=0; k<i; k++) {
                TVar sum = 0.;
                if constexpr (is_complex<TVar>::value){
                    sum += GetVal(i,k)*std::conj(GetVal(j,k));
                }else{
                    sum += GetVal(i,k)*GetVal(j,k);
                }
                PutVal( i,j,GetVal(i,j)-sum);
            }
            TVar tmp2 = GetVal(i,i);
            if ( IsZero(tmp2) ) {
				Error( "Decompose_Cholesky <Zero on diagonal>" );
            }
            PutVal(i,j,GetVal(i,j)/GetVal(i,i) );
            if constexpr (is_complex<TVar>::value){
                PutVal(j,i,std::conj(GetVal(i,j)));
            }else{
                PutVal(j,i,GetVal(i,j));
            }
        }
    }
	fDecomposed = ECholesky;
	return ECholesky;
	
}